

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

int __thiscall CaDiCaL::Solver::vars(Solver *this)

{
  State *pSVar1;
  Solver *in_RDI;
  int res;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if ((in_RDI->internal != (Internal *)0x0) && (in_RDI->trace_api_file != (FILE *)0x0)) {
    trace_api_call((Solver *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   &in_RDI->adding_clause);
  }
  require_solver_pointer_to_be_non_zero
            ((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             &in_RDI->adding_clause,(char *)0xe1fefd);
  if (in_RDI->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","int CaDiCaL::Solver::vars()",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"external solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  if (in_RDI->internal == (Internal *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","int CaDiCaL::Solver::vars()",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"internal solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  pSVar1 = state(in_RDI);
  if ((*pSVar1 & (UNSATISFIED|SATISFIED|SOLVING|ADDING|STEADY|CONFIGURING)) == 0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","int CaDiCaL::Solver::vars()",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"solver neither in valid nor solving state");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  return in_RDI->external->max_var;
}

Assistant:

int Solver::vars () {
  TRACE ("vars");
  REQUIRE_VALID_OR_SOLVING_STATE ();
  int res = external->max_var;
  LOG_API_CALL_RETURNS ("vars", res);
  return res;
}